

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.cpp
# Opt level: O3

char * mbedtls_md_get_name(mbedtls_md_info_t *md_info)

{
  char *pcVar1;
  
  pcVar1 = (char *)0x0;
  if ((md_info != (mbedtls_md_info_t *)0x0) && (md_info->type == MBEDTLS_MD_SHA256)) {
    pcVar1 = "SHA256";
  }
  return pcVar1;
}

Assistant:

const char *mbedtls_md_get_name(const mbedtls_md_info_t *md_info)
{
    if (md_info == NULL) {
        return NULL;
    }

    const md_name_entry *entry = md_names;
    while (entry->md_type != MBEDTLS_MD_NONE &&
           entry->md_type != md_info->type) {
        ++entry;
    }

    return entry->md_name;
}